

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  __uniq_ptr_data<T,_std::default_delete<T>,_true,_true> _Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  impl2 *this;
  char *__assertion;
  unique_ptr<T,_std::default_delete<T>_> object;
  
  _Var1.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
  super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<T,_std::default_delete<T>_>)operator_new(0x18);
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = &PTR__i1_00103d88;
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR__i2_00103db0;
  *(undefined8 **)
   _Var1.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
   super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
   _M_head_impl = puVar2;
  *(undefined8 **)
   ((long)_Var1.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
          super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
          _M_head_impl + 8) = puVar3;
  *(undefined4 *)
   ((long)_Var1.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
          super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
          _M_head_impl + 0x10) = 0x2a;
  object._M_t.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
  super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.super__Head_base<0UL,_T_*,_false>.
  _M_head_impl = (__uniq_ptr_data<T,_std::default_delete<T>,_true,_true>)
                 (__uniq_ptr_data<T,_std::default_delete<T>,_true,_true>)
                 _Var1.super___uniq_ptr_impl<T,_std::default_delete<T>_>._M_t.
                 super__Tuple_impl<0UL,_T_*,_std::default_delete<T>_>.
                 super__Head_base<0UL,_T_*,_false>._M_head_impl;
  lVar4 = __dynamic_cast(puVar2,&i1::typeinfo,&impl1::typeinfo,0);
  if (lVar4 == 0) {
    __assertion = "dynamic_cast<impl1*>(object->i1_.get())";
    __line = 0x38;
  }
  else {
    lVar4 = __dynamic_cast(puVar3,&i2::typeinfo,&impl2::typeinfo,0);
    if (lVar4 == 0) {
      __assertion = "dynamic_cast<impl2*>(object->i2_.get())";
      __line = 0x39;
    }
    else {
      plVar5 = (long *)operator_new(8);
      *plVar5 = (long)&PTR__i1_00103d88;
      lVar4 = __dynamic_cast(plVar5,&i1::typeinfo,&impl1::typeinfo,0);
      if (lVar4 == 0) {
        __assertion = "dynamic_cast<impl1*>(up1.get())";
        __line = 0x3c;
      }
      else {
        this = (impl2 *)operator_new(8);
        (this->super_i2)._vptr_i2 = (_func_int **)&PTR__i2_00103db0;
        lVar4 = __dynamic_cast(this,&i2::typeinfo,&impl2::typeinfo,0);
        if (lVar4 != 0) {
          impl2::~impl2(this);
          (**(code **)(*plVar5 + 8))(plVar5);
          std::unique_ptr<T,_std::default_delete<T>_>::~unique_ptr(&object);
          return 0;
        }
        __assertion = "dynamic_cast<impl2*>(up2.get())";
        __line = 0x3e;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module1(), module2());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->i1_.get()));
  assert(dynamic_cast<impl2*>(object->i2_.get()));
  assert(42 == object->i);
  auto up1 = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(up1.get()));
  auto up2 = injector.create<std::unique_ptr<i2>>();
  assert(dynamic_cast<impl2*>(up2.get()));
}